

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O0

void __thiscall SDIOAnalyzer::SDIOAnalyzer(SDIOAnalyzer *this)

{
  SDIOAnalyzerSettings *this_00;
  FrameV2 *this_01;
  U8 *local_50;
  SDIOAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SDIOAnalyzer_00115ca0;
  this_00 = (SDIOAnalyzerSettings *)operator_new(0xc0);
  SDIOAnalyzerSettings::SDIOAnalyzerSettings(this_00);
  std::unique_ptr<SDIOAnalyzerSettings,std::default_delete<SDIOAnalyzerSettings>>::
  unique_ptr<std::default_delete<SDIOAnalyzerSettings>,void>
            ((unique_ptr<SDIOAnalyzerSettings,std::default_delete<SDIOAnalyzerSettings>> *)
             &this->mSettings,this_00);
  std::unique_ptr<SDIOAnalyzerResults,std::default_delete<SDIOAnalyzerResults>>::
  unique_ptr<std::default_delete<SDIOAnalyzerResults>,void>
            ((unique_ptr<SDIOAnalyzerResults,std::default_delete<SDIOAnalyzerResults>> *)
             &this->mResults);
  SDIOSimulationDataGenerator::SDIOSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitialized = false;
  this->mAlreadyRun = false;
  this->packetState = 0;
  this->frameState = 0;
  this->byte = '\0';
  this->data[0] = '\0';
  local_50 = this->data + 1;
  do {
    *local_50 = '\0';
    local_50 = local_50 + 1;
  } while (local_50 != &this->field_0xbe);
  this->byteCounter = 0;
  this->qwordHigh = 0;
  this->qwordLow = 0;
  this->startingSampleInclusive = 0;
  this->endingSampleInclusive = 0;
  this_01 = (FrameV2 *)operator_new(8);
  FrameV2::FrameV2(this_01);
  std::unique_ptr<FrameV2,std::default_delete<FrameV2>>::
  unique_ptr<std::default_delete<FrameV2>,void>
            ((unique_ptr<FrameV2,std::default_delete<FrameV2>> *)&this->frameV2,this_01);
  std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::get
            (&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

SDIOAnalyzer::SDIOAnalyzer()
    : Analyzer2(),
      mSettings( new SDIOAnalyzerSettings() ),
      mSimulationInitialized( false ),
      mAlreadyRun( false ),
      packetState( WAITING_FOR_PACKET ),
      frameState( TRANSMISSION_BIT ),
      frameV2( std::unique_ptr<FrameV2>( new FrameV2 ) )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}